

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcomplex.c
# Opt level: O1

doublecomplex z_sgn(doublecomplex *z)

{
  double dVar1;
  double dVar2;
  double dVar3;
  doublecomplex dVar4;
  
  dVar1 = z_abs(z);
  dVar3 = 0.0;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar2 = z->r / dVar1;
    dVar3 = z->i / dVar1;
  }
  else {
    dVar2 = 1.0;
  }
  dVar4.i = dVar3;
  dVar4.r = dVar2;
  return dVar4;
}

Assistant:

doublecomplex z_sgn(doublecomplex *z)
{
    register double t = z_abs(z);
    register doublecomplex retval;

    if (t == 0.0) {
	retval.r = 1.0, retval.i = 0.0;
    } else {
	retval.r = z->r / t, retval.i = z->i / t;
    }

    return retval;
}